

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDef.cpp
# Opt level: O0

ostream * operator<<(ostream *os,AmsNetId *netId)

{
  void *this;
  ostream *poVar1;
  AmsNetId *netId_local;
  ostream *os_local;
  
  this = (void *)std::ostream::operator<<(os,std::dec);
  poVar1 = (ostream *)std::ostream::operator<<(this,(uint)netId->b[0]);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)netId->b[1]);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)netId->b[2]);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)netId->b[3]);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)netId->b[4]);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)netId->b[5]);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const AmsNetId& netId)
{
    return os << std::dec << (int)netId.b[0] << '.' << (int)netId.b[1] << '.' << (int)netId.b[2] << '.' <<
           (int)netId.b[3] << '.' << (int)netId.b[4] << '.' << (int)netId.b[5];
}